

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O3

void __thiscall tst_RootIndexProxyModel::bug53MoveCols(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModelTester *pQVar5;
  GenericModel baseModel;
  RootIndexProxyModel proxyModel2;
  RootIndexProxyModel proxyModel1;
  QSignalSpy proxy1ColumnsAboutToBeInsertedSpy;
  QSignalSpy proxy1ColumnsInsertedSpy;
  QSignalSpy proxy2ColumnsAboutToBeInsertedSpy;
  QSignalSpy proxy2ColumnsInsertedSpy;
  QSignalSpy proxy1ColumnsAboutToBeMovedSpy;
  QSignalSpy proxy1ColumnsMovedSpy;
  QSignalSpy proxy1ColumnsRemovedSpy;
  QSignalSpy proxy1ColumnsAboutToBeRemovedSpy;
  QSignalSpy proxy2ColumnsAboutToBeMovedSpy;
  QSignalSpy proxy2ColumnsMovedSpy;
  QSignalSpy proxy2ColumnsRemovedSpy;
  QSignalSpy proxy2ColumnsAboutToBeRemovedSpy;
  QModelIndex local_6b8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  QModelIndex local_688;
  QModelIndex local_670;
  undefined1 local_658 [32];
  longlong local_638;
  long local_620;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  longlong local_5a0;
  long local_588;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  QSignalSpy local_528;
  QSignalSpy local_4a8;
  QSignalSpy local_428;
  QSignalSpy local_3a8;
  QSignalSpy local_328;
  QSignalSpy local_2a8;
  QSignalSpy local_228;
  QSignalSpy local_1a8;
  QSignalSpy local_128;
  QSignalSpy local_a8;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  GenericModel::GenericModel((GenericModel *)&local_6b8,(QObject *)0x0);
  local_658._0_8_ = -NAN;
  local_658._8_8_ = 0;
  local_658._16_8_ = 0;
  bVar1 = (bool)(**(code **)(local_6b8._0_8_ + 0x100))(&local_6b8,0,1);
  cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0x27a);
  if (cVar2 != '\0') {
    local_658._0_8_ = (PrivateShared *)0xffffffffffffffff;
    local_658._8_8_ = 0;
    local_658._16_8_ = 0;
    iVar4 = (int)&local_6b8;
    bVar1 = (bool)GenericModel::insertRows(iVar4,0,(QModelIndex *)0x2);
    cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 2)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x27b);
    if (cVar2 != '\0') {
      local_5c0._0_8_ = (PrivateShared *)0xffffffffffffffff;
      local_5c0._8_8_ = 0;
      local_5c0._16_8_ = 0;
      GenericModel::index((int)local_658,iVar4,(QModelIndex *)0x0);
      bVar1 = (bool)(**(code **)(local_6b8._0_8_ + 0x100))(&local_6b8,0,1,local_658);
      cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(0, 0))","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x27c);
      if (cVar2 != '\0') {
        local_5c0._0_8_ = (PrivateShared *)0xffffffffffffffff;
        local_5c0._8_8_ = 0;
        local_5c0._16_8_ = 0;
        GenericModel::index((int)local_658,iVar4,(QModelIndex *)0x0);
        bVar1 = (bool)GenericModel::insertRows(iVar4,0,(QModelIndex *)0x2);
        cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 2, baseModel.index(0, 0))","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x27d);
        if (cVar2 != '\0') {
          local_5c0._0_8_ = (PrivateShared *)0xffffffffffffffff;
          local_5c0._8_8_ = 0;
          local_5c0._16_8_ = 0;
          GenericModel::index((int)local_658,iVar4,(QModelIndex *)0x1);
          bVar1 = (bool)(**(code **)(local_6b8._0_8_ + 0x100))(&local_6b8,0,1,local_658);
          cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(1, 0))","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                 ,0x27e);
          if (cVar2 != '\0') {
            local_5c0._0_8_ = (PrivateShared *)0xffffffffffffffff;
            local_5c0._8_8_ = 0;
            local_5c0._16_8_ = 0;
            GenericModel::index((int)local_658,iVar4,(QModelIndex *)0x1);
            bVar1 = (bool)GenericModel::insertRows(iVar4,0,(QModelIndex *)0x1);
            cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 1, baseModel.index(1, 0))","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0x27f);
            if (cVar2 != '\0') {
              local_528.super_QObject = (QObject)0xff;
              local_528._1_7_ = 0xffffffffffffff;
              local_528._8_8_ = 0;
              local_528.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
              GenericModel::index((int)local_5c0,iVar4,(QModelIndex *)0x0);
              QVariant::QVariant((QVariant *)local_658,(QChar)0x41);
              bVar1 = (bool)GenericModel::setData(&local_6b8,(QVariant *)local_5c0,(int)local_658);
              cVar2 = QTest::qVerify(bVar1,
                                     "baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char(\'A\')))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x280);
              QVariant::~QVariant((QVariant *)local_658);
              if (cVar2 != '\0') {
                local_4a8.super_QObject = (QObject)0xff;
                local_4a8._1_7_ = 0xffffffffffffff;
                local_4a8._8_8_ = 0;
                local_4a8.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                GenericModel::index((int)&local_528,iVar4,(QModelIndex *)0x0);
                GenericModel::index((int)local_5c0,iVar4,(QModelIndex *)0x0);
                QVariant::QVariant((QVariant *)local_658,(QChar)0x43);
                bVar1 = (bool)GenericModel::setData(&local_6b8,(QVariant *)local_5c0,(int)local_658)
                ;
                cVar2 = QTest::qVerify(bVar1,
                                       "baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'C\')))"
                                       ,"",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                       ,0x281);
                QVariant::~QVariant((QVariant *)local_658);
                if (cVar2 != '\0') {
                  local_4a8.super_QObject = (QObject)0xff;
                  local_4a8._1_7_ = 0xffffffffffffff;
                  local_4a8._8_8_ = 0;
                  local_4a8.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                  GenericModel::index((int)&local_528,iVar4,(QModelIndex *)0x0);
                  GenericModel::index((int)local_5c0,iVar4,(QModelIndex *)0x1);
                  QVariant::QVariant((QVariant *)local_658,(QChar)0x44);
                  bVar1 = (bool)GenericModel::setData
                                          (&local_6b8,(QVariant *)local_5c0,(int)local_658);
                  cVar2 = QTest::qVerify(bVar1,
                                         "baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'D\')))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                         ,0x282);
                  QVariant::~QVariant((QVariant *)local_658);
                  if (cVar2 != '\0') {
                    local_528.super_QObject = (QObject)0xff;
                    local_528._1_7_ = 0xffffffffffffff;
                    local_528._8_8_ = 0;
                    local_528.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                    GenericModel::index((int)local_5c0,iVar4,(QModelIndex *)0x1);
                    QVariant::QVariant((QVariant *)local_658,(QChar)0x42);
                    bVar1 = (bool)GenericModel::setData
                                            (&local_6b8,(QVariant *)local_5c0,(int)local_658);
                    cVar2 = QTest::qVerify(bVar1,
                                           "baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char(\'B\')))"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0x283);
                    QVariant::~QVariant((QVariant *)local_658);
                    if (cVar2 != '\0') {
                      local_4a8.super_QObject = (QObject)0xff;
                      local_4a8._1_7_ = 0xffffffffffffff;
                      local_4a8._8_8_ = 0;
                      local_4a8.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                      GenericModel::index((int)&local_528,iVar4,(QModelIndex *)0x1);
                      GenericModel::index((int)local_5c0,iVar4,(QModelIndex *)0x0);
                      QVariant::QVariant((QVariant *)local_658,(QChar)0x45);
                      bVar1 = (bool)GenericModel::setData
                                              (&local_6b8,(QVariant *)local_5c0,(int)local_658);
                      cVar2 = QTest::qVerify(bVar1,
                                             "baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char(\'E\')))"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x284);
                      QVariant::~QVariant((QVariant *)local_658);
                      if (cVar2 != '\0') {
                        RootIndexProxyModel::RootIndexProxyModel
                                  ((RootIndexProxyModel *)&local_670,(QObject *)0x0);
                        pQVar5 = (QAbstractItemModelTester *)operator_new(0x10);
                        QAbstractItemModelTester::QAbstractItemModelTester
                                  (pQVar5,(QAbstractItemModel *)&local_670,QtTest,
                                   (QObject *)&local_6b8);
                        *(undefined ***)pQVar5 = &PTR_metaObject_00124c88;
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&local_670);
                        local_5c0._0_8_ = -NAN;
                        local_5c0._8_8_ = 0;
                        local_5c0._16_8_ = 0;
                        GenericModel::index((int)local_658,iVar4,(QModelIndex *)0x0);
                        RootIndexProxyModel::setRootIndex(&local_670);
                        RootIndexProxyModel::RootIndexProxyModel
                                  ((RootIndexProxyModel *)&local_688,(QObject *)0x0);
                        pQVar5 = (QAbstractItemModelTester *)operator_new(0x10);
                        QAbstractItemModelTester::QAbstractItemModelTester
                                  (pQVar5,(QAbstractItemModel *)&local_688,QtTest,
                                   (QObject *)&local_6b8);
                        *(undefined ***)pQVar5 = &PTR_metaObject_00124c88;
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&local_688);
                        local_5c0._0_8_ = (PrivateShared *)0xffffffffffffffff;
                        local_5c0._8_8_ = 0;
                        local_5c0._16_8_ = 0;
                        GenericModel::index((int)local_658,iVar4,(QModelIndex *)0x1);
                        RootIndexProxyModel::setRootIndex(&local_688);
                        QSignalSpy::QSignalSpy
                                  ((QSignalSpy *)local_658,(QObject *)&local_670,
                                   "2columnsAboutToBeInserted(QModelIndex, int, int)");
                        cVar2 = QTest::qVerify(local_620 != 0,
                                               "proxy1ColumnsAboutToBeInsertedSpy.isValid()","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                               ,0x28e);
                        if (cVar2 != '\0') {
                          QSignalSpy::QSignalSpy
                                    ((QSignalSpy *)local_5c0,(QObject *)&local_670,
                                     "2columnsInserted(QModelIndex, int, int)");
                          cVar2 = QTest::qVerify(local_588 != 0,"proxy1ColumnsInsertedSpy.isValid()"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                 ,0x290);
                          if (cVar2 != '\0') {
                            QSignalSpy::QSignalSpy
                                      (&local_528,(QObject *)&local_688,
                                       "2columnsAboutToBeInserted(QModelIndex, int, int)");
                            cVar2 = QTest::qVerify(local_528.sig.d.size != 0,
                                                   "proxy2ColumnsAboutToBeInsertedSpy.isValid()","",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x292);
                            if (cVar2 != '\0') {
                              QSignalSpy::QSignalSpy
                                        (&local_4a8,(QObject *)&local_688,
                                         "2columnsInserted(QModelIndex, int, int)");
                              cVar2 = QTest::qVerify(local_4a8.sig.d.size != 0,
                                                     "proxy2ColumnsInsertedSpy.isValid()","",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x294);
                              if (cVar2 != '\0') {
                                QSignalSpy::QSignalSpy
                                          (&local_2a8,(QObject *)&local_670,
                                           "2columnsAboutToBeRemoved(QModelIndex, int, int)");
                                cVar2 = QTest::qVerify(local_2a8.sig.d.size != 0,
                                                       "proxy1ColumnsAboutToBeRemovedSpy.isValid()",
                                                       "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x296);
                                if (cVar2 != '\0') {
                                  QSignalSpy::QSignalSpy
                                            (&local_328,(QObject *)&local_670,
                                             "2columnsRemoved(QModelIndex, int, int)");
                                  cVar2 = QTest::qVerify(local_328.sig.d.size != 0,
                                                         "proxy1ColumnsRemovedSpy.isValid()","",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x298);
                                  if (cVar2 != '\0') {
                                    QSignalSpy::QSignalSpy
                                              (&local_a8,(QObject *)&local_688,
                                               "2columnsAboutToBeRemoved(QModelIndex, int, int)");
                                    cVar2 = QTest::qVerify(local_a8.sig.d.size != 0,
                                                                                                                      
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x29a);
                                    if (cVar2 != '\0') {
                                      QSignalSpy::QSignalSpy
                                                (&local_128,(QObject *)&local_688,
                                                 "2columnsRemoved(QModelIndex, int, int)");
                                      cVar2 = QTest::qVerify(local_128.sig.d.size != 0,
                                                             "proxy2ColumnsRemovedSpy.isValid()","",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x29c);
                                      if (cVar2 != '\0') {
                                        QSignalSpy::QSignalSpy
                                                  (&local_3a8,(QObject *)&local_670,
                                                                                                      
                                                  "2columnsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                        cVar2 = QTest::qVerify(local_3a8.sig.d.size != 0,
                                                               "proxy1ColumnsMovedSpy.isValid()","",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x29e);
                                        if (cVar2 != '\0') {
                                          QSignalSpy::QSignalSpy
                                                    (&local_428,(QObject *)&local_670,
                                                                                                          
                                                  "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                          cVar2 = QTest::qVerify(local_428.sig.d.size != 0,
                                                                                                                                  
                                                  "proxy1ColumnsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a0);
                                          if (cVar2 != '\0') {
                                            QSignalSpy::QSignalSpy
                                                      (&local_1a8,(QObject *)&local_688,
                                                                                                              
                                                  "2columnsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                            cVar2 = QTest::qVerify(local_1a8.sig.d.size != 0,
                                                                   "proxy2ColumnsMovedSpy.isValid()"
                                                                   ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a2);
                                            if (cVar2 != '\0') {
                                              QSignalSpy::QSignalSpy
                                                        (&local_228,(QObject *)&local_688,
                                                                                                                  
                                                  "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                              cVar2 = QTest::qVerify(local_228.sig.d.size != 0,
                                                                                                                                          
                                                  "proxy2ColumnsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a4);
                                              if (cVar2 != '\0') {
                                                local_5d8 = 0xffffffffffffffff;
                                                local_5d0 = 0;
                                                uStack_5c8 = 0;
                                                GenericModel::index((int)&local_6a0,iVar4,
                                                                    (QModelIndex *)0x0);
                                                bVar1 = (bool)(**(code **)(local_6b8._0_8_ + 0x100))
                                                                        (&local_6b8,1,1,&local_6a0);
                                                cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.insertColumn(1, baseModel.index(0, 0))"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a5);
                                                if (cVar2 != '\0') {
                                                  local_6a0 = 0xffffffffffffffff;
                                                  local_698 = 0;
                                                  uStack_690 = 0;
                                                  iVar3 = RootIndexProxyModel::columnCount
                                                                    (&local_670);
                                                  cVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.columnCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a6);
                                                  if (cVar2 != '\0') {
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      (&local_688);
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a7);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_528.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a8);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_4a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a9);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_2a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2aa);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_328.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ab);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_a8.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ac);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_128.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ad);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_428.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ae);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_3a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2af);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_228.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b0);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_1a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b1);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_638,1,
                                                                                                                                                        
                                                  "proxy1ColumnsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b2);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_5a0,1,
                                                                                                                                                        
                                                  "proxy1ColumnsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b3);
                                                  if (cVar2 != '\0') {
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               (local_658 + 0x10));
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               (local_5c0 + 0x10));
                                                    local_5d8 = 0xffffffffffffffff;
                                                    local_5d0 = 0;
                                                    uStack_5c8 = 0;
                                                    GenericModel::index((int)&local_6a0,iVar4,
                                                                        (QModelIndex *)0x0);
                                                    local_28 = 0xffffffffffffffff;
                                                    local_20 = 0;
                                                    uStack_18 = 0;
                                                    GenericModel::index((int)&local_540,iVar4,
                                                                        (QModelIndex *)0x0);
                                                    bVar1 = (bool)(**(code **)(local_6b8._0_8_ +
                                                                              0x120))(&local_6b8,
                                                                                      &local_6a0,1,1
                                                                                      ,&local_540,0)
                                                    ;
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumn(baseModel.index(0, 0), 1, baseModel.index(0, 0), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b7);
                                                  if (cVar2 != '\0') {
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      (&local_670);
                                                    cVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.columnCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b8);
                                                  if (cVar2 != '\0') {
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      (&local_688);
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b9);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_428.
                                                                                                                                                        
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1ColumnsAboutToBeMovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ba);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_3a8.
                                                                                                                                                        
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1ColumnsMovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,699);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_228.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,700);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_1a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2bd);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_638 == 0,
                                                                                                                                                      
                                                  "proxy1ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2be);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_5a0 == 0,
                                                                                                                                                      
                                                  "proxy1ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2bf);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_528.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c0);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_4a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c1);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_2a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c2);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_328.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c3);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_a8.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c4);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_128.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c5);
                                                  if (cVar2 != '\0') {
                                                    QList<QList<QVariant>_>::clear
                                                              (&local_428.
                                                                super_QList<QList<QVariant>_>);
                                                    QList<QList<QVariant>_>::clear
                                                              (&local_3a8.
                                                                super_QList<QList<QVariant>_>);
                                                    local_5d8 = 0xffffffffffffffff;
                                                    local_5d0 = 0;
                                                    uStack_5c8 = 0;
                                                    GenericModel::index((int)&local_6a0,iVar4,
                                                                        (QModelIndex *)0x0);
                                                    local_540 = 0xffffffffffffffff;
                                                    local_538 = 0;
                                                    uStack_530 = 0;
                                                    bVar1 = (bool)(**(code **)(local_6b8._0_8_ +
                                                                              0x120))(&local_6b8,
                                                                                      &local_6a0,0,1
                                                                                      ,&local_540,0)
                                                    ;
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumn(baseModel.index(0, 0), 0, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c9);
                                                  if (cVar2 != '\0') {
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      (&local_670);
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel1.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ca);
                                                  if (cVar2 != '\0') {
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      (&local_688);
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cb);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_2a8.
                                                                                                                                                        
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cc);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_328.
                                                                                                                                                        
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1ColumnsRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cd);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_228.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ce);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_1a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cf);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_638 == 0,
                                                                                                                                                      
                                                  "proxy1ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d0);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_5a0 == 0,
                                                                                                                                                      
                                                  "proxy1ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d1);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_528.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d2);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_4a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d3);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_428.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d4);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_3a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d5);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_a8.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d6);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_128.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d7);
                                                  if (cVar2 != '\0') {
                                                    QList<QList<QVariant>_>::clear
                                                              (&local_2a8.
                                                                super_QList<QList<QVariant>_>);
                                                    QList<QList<QVariant>_>::clear
                                                              (&local_328.
                                                                super_QList<QList<QVariant>_>);
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    local_540 = 0xffffffffffffffff;
                                                    local_538 = 0;
                                                    uStack_530 = 0;
                                                    GenericModel::index((int)&local_5d8,iVar4,
                                                                        (QModelIndex *)0x0);
                                                    bVar1 = (bool)(**(code **)(local_6b8._0_8_ +
                                                                              0x120))(&local_6b8,
                                                                                      &local_6a0,0,1
                                                                                      ,&local_5d8,0)
                                                    ;
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumn(QModelIndex(), 0, baseModel.index(0, 1), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2db);
                                                  if (cVar2 != '\0') {
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    iVar4 = RootIndexProxyModel::columnCount
                                                                      (&local_670);
                                                    cVar2 = QTest::qCompare(iVar4,2,
                                                  "proxyModel1.columnCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2dc);
                                                  if (cVar2 != '\0') {
                                                    local_6a0 = 0xffffffffffffffff;
                                                    local_698 = 0;
                                                    uStack_690 = 0;
                                                    iVar4 = RootIndexProxyModel::columnCount
                                                                      (&local_688);
                                                    cVar2 = QTest::qCompare(iVar4,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2dd);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_428.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2de);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_3a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2df);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_228.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e0);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_1a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e1);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_638,1,
                                                                                                                                                        
                                                  "proxy1ColumnsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e2);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_5a0,1,
                                                                                                                                                        
                                                  "proxy1ColumnsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e3);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_528.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e4);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_4a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e5);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_2a8.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e6);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_328.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e7);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_a8.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e8);
                                                  if (cVar2 != '\0') {
                                                    QTest::qVerify(local_128.
                                                                   super_QList<QList<QVariant>_>.d.
                                                                   size == 0,
                                                                                                                                      
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e9);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              QSignalSpy::~QSignalSpy(&local_228);
                                            }
                                            QSignalSpy::~QSignalSpy(&local_1a8);
                                          }
                                          QSignalSpy::~QSignalSpy(&local_428);
                                        }
                                        QSignalSpy::~QSignalSpy(&local_3a8);
                                      }
                                      QSignalSpy::~QSignalSpy(&local_128);
                                    }
                                    QSignalSpy::~QSignalSpy(&local_a8);
                                  }
                                  QSignalSpy::~QSignalSpy(&local_328);
                                }
                                QSignalSpy::~QSignalSpy(&local_2a8);
                              }
                              QSignalSpy::~QSignalSpy(&local_4a8);
                            }
                            QSignalSpy::~QSignalSpy(&local_528);
                          }
                          QSignalSpy::~QSignalSpy((QSignalSpy *)local_5c0);
                        }
                        QSignalSpy::~QSignalSpy((QSignalSpy *)local_658);
                        RootIndexProxyModel::~RootIndexProxyModel((RootIndexProxyModel *)&local_688)
                        ;
                        RootIndexProxyModel::~RootIndexProxyModel((RootIndexProxyModel *)&local_670)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  GenericModel::~GenericModel((GenericModel *)&local_6b8);
  return;
}

Assistant:

void tst_RootIndexProxyModel::bug53MoveCols()
{
#ifdef QTMODELUTILITIES_GENERICMODEL
    GenericModel baseModel;
    QVERIFY(baseModel.insertColumn(0));
    QVERIFY(baseModel.insertRows(0, 2));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertRows(0, 2, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(1, 0)));
    QVERIFY(baseModel.insertRows(0, 1, baseModel.index(1, 0)));
    QVERIFY(baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char('A'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char('C'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char('D'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char('B'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char('E'))));
    RootIndexProxyModel proxyModel1;
    new ModelTest(&proxyModel1, &baseModel);
    proxyModel1.setSourceModel(&baseModel);
    proxyModel1.setRootIndex(baseModel.index(0, 0));
    RootIndexProxyModel proxyModel2;
    new ModelTest(&proxyModel2, &baseModel);
    proxyModel2.setSourceModel(&baseModel);
    proxyModel2.setRootIndex(baseModel.index(1, 0));
    QSignalSpy proxy1ColumnsAboutToBeInsertedSpy(&proxyModel1, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy1ColumnsInsertedSpy(&proxyModel1, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsInsertedSpy.isValid());
    QSignalSpy proxy2ColumnsAboutToBeInsertedSpy(&proxyModel2, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy2ColumnsInsertedSpy(&proxyModel2, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsInsertedSpy.isValid());
    QSignalSpy proxy1ColumnsAboutToBeRemovedSpy(&proxyModel1, SIGNAL(columnsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy1ColumnsRemovedSpy(&proxyModel1, SIGNAL(columnsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsRemovedSpy.isValid());
    QSignalSpy proxy2ColumnsAboutToBeRemovedSpy(&proxyModel2, SIGNAL(columnsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy2ColumnsRemovedSpy(&proxyModel2, SIGNAL(columnsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsRemovedSpy.isValid());
    QSignalSpy proxy1ColumnsMovedSpy(&proxyModel1, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1ColumnsMovedSpy.isValid());
    QSignalSpy proxy1ColumnsAboutToBeMovedSpy(&proxyModel1, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isValid());
    QSignalSpy proxy2ColumnsMovedSpy(&proxyModel2, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2ColumnsMovedSpy.isValid());
    QSignalSpy proxy2ColumnsAboutToBeMovedSpy(&proxyModel2, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isValid());
    QVERIFY(baseModel.insertColumn(1, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.columnCount(), 2);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QCOMPARE(proxy1ColumnsAboutToBeInsertedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsInsertedSpy.count(), 1);
    proxy1ColumnsAboutToBeInsertedSpy.clear();
    proxy1ColumnsInsertedSpy.clear();

    QVERIFY(baseModel.moveColumn(baseModel.index(0, 0), 1, baseModel.index(0, 0), 0));
    QCOMPARE(proxyModel1.columnCount(), 2);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QCOMPARE(proxy1ColumnsAboutToBeMovedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsMovedSpy.count(), 1);
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
    proxy1ColumnsAboutToBeMovedSpy.clear();
    proxy1ColumnsMovedSpy.clear();

    QVERIFY(baseModel.moveColumn(baseModel.index(0, 0), 0, QModelIndex(), 0));
    QCOMPARE(proxyModel1.columnCount(), 1);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QCOMPARE(proxy1ColumnsAboutToBeRemovedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsRemovedSpy.count(), 1);
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
    proxy1ColumnsAboutToBeRemovedSpy.clear();
    proxy1ColumnsRemovedSpy.clear();

    QVERIFY(baseModel.moveColumn(QModelIndex(), 0, baseModel.index(0, 1), 0));
    QCOMPARE(proxyModel1.columnCount(), 2);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QCOMPARE(proxy1ColumnsAboutToBeInsertedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsInsertedSpy.count(), 1);
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
#else
    QSKIP("This test requires the GenericModel module");
#endif
}